

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::execAdda<(moira::Instr)5,(moira::Mode)10,(moira::Size)4>(Moira *this,u16 opcode)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  ushort in_SI;
  Moira *in_RDI;
  int dst;
  int src;
  u32 result;
  u32 data;
  u32 ea;
  undefined4 in_stack_ffffffffffffffe8;
  uint in_stack_ffffffffffffffec;
  undefined2 in_stack_fffffffffffffff4;
  
  uVar2 = in_SI & 7;
  uVar3 = (int)(uint)in_SI >> 9 & 7;
  bVar1 = readOp<(moira::Mode)10,(moira::Size)4,128ul>
                    (in_RDI,CONCAT22(in_SI,in_stack_fffffffffffffff4),
                     (u32 *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                     (u32 *)((ulong)CONCAT24(in_SI,(int)(uint)in_SI >> 9) & 0x700000007));
  if (bVar1) {
    SEXT<(moira::Size)4>((ulong)in_stack_ffffffffffffffec);
    readA<(moira::Size)4>((Moira *)CONCAT44(uVar2,uVar3),(int)((ulong)in_RDI >> 0x20));
    prefetch<4ul>((Moira *)CONCAT44(uVar2,uVar3));
    (*in_RDI->_vptr_Moira[0x19])(in_RDI,2);
    bVar1 = isRegMode(MODE_IXPC);
    if ((bVar1) || (bVar1 = isImmMode(MODE_IXPC), bVar1)) {
      (*in_RDI->_vptr_Moira[0x19])(in_RDI,2);
    }
    writeA<(moira::Size)4>((Moira *)CONCAT44(uVar2,uVar3),(int)((ulong)in_RDI >> 0x20),(u32)in_RDI);
  }
  return;
}

Assistant:

void
Moira::execAdda(u16 opcode)
{
    u32 ea, data, result;

    int src = _____________xxx(opcode);
    int dst = ____xxx_________(opcode);

    if (!readOp<M,S, STD_AE_FRAME>(src, ea, data)) return;
    data = SEXT<S>(data);

    result = (I == ADDA) ? readA(dst) + data : readA(dst) - data;
    prefetch<POLLIPL>();

    sync(2);
    if (S == Word || isRegMode(M) || isImmMode(M)) sync(2);
    writeA(dst, result);
}